

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1692::TestCase1692(TestCase1692 *this)

{
  TestCase1692 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x69c,"legacy test: Encoding/Embeds");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005c12a8;
  return;
}

Assistant:

TEST(Encoding, Embeds) {
  {
    kj::ArrayInputStream input(test::EMBEDDED_DATA);
    PackedMessageReader reader(input);
    checkTestMessage(reader.getRoot<TestAllTypes>());
  }

#if !CAPNP_LITE

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<TestAllTypes>();
    initTestMessage(root);
    kj::StringPtr text = test::EMBEDDED_TEXT;
    EXPECT_EQ(kj::str(root, text.endsWith("\r\n") ? "\r\n" : "\n"), text);
  }

#endif // CAPNP_LITE

  {
    checkTestMessage(test::EMBEDDED_STRUCT);
  }
}